

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O1

void __thiscall
Connection::Connection(Connection *this,string *name_from,string *name_to,string *label)

{
  string *psVar1;
  pointer pcVar2;
  size_type sVar3;
  size_type sVar4;
  
  (this->name_from)._M_dataplus._M_p = (pointer)&(this->name_from).field_2;
  pcVar2 = (name_from->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar2,pcVar2 + name_from->_M_string_length);
  psVar1 = &this->name_to;
  (this->name_to)._M_dataplus._M_p = (pointer)&(this->name_to).field_2;
  pcVar2 = (name_to->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)psVar1,pcVar2,pcVar2 + name_to->_M_string_length);
  (this->label)._M_dataplus._M_p = (pointer)&(this->label).field_2;
  pcVar2 = (label->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->label,pcVar2,pcVar2 + label->_M_string_length);
  std::__cxx11::string::_M_replace
            ((ulong)this,0,(char *)(this->name_from)._M_string_length,0x1430a4);
  sVar3 = name_from->_M_string_length;
  if (sVar3 != 0) {
    sVar4 = 0;
    do {
      std::__cxx11::string::push_back((char)this);
      sVar4 = sVar4 + 1;
    } while (sVar3 != sVar4);
  }
  std::__cxx11::string::_M_replace
            ((ulong)psVar1,0,(char *)(this->name_to)._M_string_length,0x1430a4);
  sVar3 = name_to->_M_string_length;
  if (sVar3 != 0) {
    sVar4 = 0;
    do {
      std::__cxx11::string::push_back((char)psVar1);
      sVar4 = sVar4 + 1;
    } while (sVar3 != sVar4);
  }
  return;
}

Assistant:

Connection::Connection(const string &name_from, const string &name_to, const string &label) : name_from(name_from),
                                                                                              name_to(name_to),
                                                                                              label(label) {
    this->name_from = "";
    for (char c: name_from) {
        if (c == '#')
            c = '_';
        this->name_from += c;
    }

    this->name_to = "";
    for (char c: name_to) {
        if (c == '#')
            c = '_';
        this->name_to += c;
    }
}